

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

void do_cmd_fire(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *local_30;
  object *obj;
  object *bow;
  ranged_attack attack;
  wchar_t shots;
  wchar_t dir;
  command_conflict *cmd_local;
  
  attack._0_4_ = (player->state).num_shots;
  bow = (object *)make_ranged_shot;
  _shots = cmd;
  obj = equipped_item_by_slot_name(player,"shooting");
  _Var1 = player_get_resume_normal_shape(player,_shots);
  if ((_Var1) &&
     (wVar2 = cmd_get_item((command *)_shots,"item",&local_30,"Fire which ammunition?",
                           "You have no suitable ammunition to fire.",obj_can_fire,L'Ȏ'),
     wVar2 == L'\0')) {
    if ((obj == (object *)0x0) || ((player->state).ammo_tval == L'\0')) {
      msg("You have nothing to fire with.");
    }
    else {
      _Var1 = item_is_available(local_30);
      if (_Var1) {
        if ((uint)local_30->tval == (player->state).ammo_tval) {
          wVar2 = cmd_get_target((command *)_shots,"target",(int *)((long)&attack + 4));
          if (wVar2 == L'\0') {
            player_confuse_dir(player,(int *)((long)&attack + 4),false);
            ranged_helper(player,obj,local_30,attack._4_4_,(wchar_t)attack,(ranged_attack)bow);
          }
        }
        else {
          msg("That ammo cannot be fired by your current weapon.");
        }
      }
      else {
        msg("That item is not within your reach.");
      }
    }
  }
  return;
}

Assistant:

void do_cmd_fire(struct command *cmd) {
	int dir;
	int shots = player->state.num_shots;

	ranged_attack attack = make_ranged_shot;

	struct object *bow = equipped_item_by_slot_name(player, "shooting");
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Get arguments */
	if (cmd_get_item(cmd, "item", &obj,
			/* Prompt */ "Fire which ammunition?",
			/* Error  */ "You have no suitable ammunition to fire.",
			/* Filter */ obj_can_fire,
			/* Choice */ USE_INVEN | USE_QUIVER | USE_FLOOR | QUIVER_TAGS)
		!= CMD_OK)
		return;

	/* Require a usable launcher */
	if (!bow || !player->state.ammo_tval) {
		msg("You have nothing to fire with.");
		return;
	}

	/* Check the item being fired is usable by the player. */
	if (!item_is_available(obj)) {
		msg("That item is not within your reach.");
		return;
	}

	/* Check the ammo can be used with the launcher */
	if (obj->tval != player->state.ammo_tval) {
		msg("That ammo cannot be fired by your current weapon.");
		return;
	}

	if (cmd_get_target(cmd, "target", &dir) == CMD_OK)
		player_confuse_dir(player, &dir, false);
	else
		return;

	ranged_helper(player, bow, obj, dir, shots, attack);
}